

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS AddNewLineAndIndentation(JlBuffer *JsonBuffer,_Bool IndentedFormat,uint32_t Depth)

{
  JL_STATUS JVar1;
  size_t sVar2;
  undefined7 in_register_00000031;
  char indentString [256];
  
  JVar1 = JL_STATUS_SUCCESS;
  if ((int)CONCAT71(in_register_00000031,IndentedFormat) != 0) {
    sVar2 = JlBufferGetDataSize(JsonBuffer);
    JVar1 = JL_STATUS_SUCCESS;
    if (sVar2 != 0) {
      JVar1 = JlBufferAdd(JsonBuffer,"\n",1);
      if (JVar1 == JL_STATUS_SUCCESS) {
        memset(indentString,0x20,0x100);
        JVar1 = JL_STATUS_SUCCESS;
        if (1 < Depth) {
          JVar1 = JlBufferAdd(JsonBuffer,indentString,(ulong)(Depth * 4 - 4));
        }
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    AddNewLineAndIndentation
    (
        JlBuffer*       JsonBuffer,
        bool            IndentedFormat,
        uint32_t        Depth
    )
{
    JL_STATUS jlStatus;

    if( IndentedFormat )
    {
        if( JlBufferGetDataSize( JsonBuffer ) > 0 )
        {
            jlStatus = JlBufferAdd( JsonBuffer, "\n", 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                char indentString [MAX_JSON_DEPTH*4];
                memset( indentString, ' ', sizeof(indentString) );

                if( Depth > 1 )
                {
                    jlStatus = JlBufferAdd( JsonBuffer, indentString, (Depth-1)*4 );
                }
            }
        }
        else
        {
            // Suppress first newline and indent
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else
    {
        jlStatus = JL_STATUS_SUCCESS;
    }

    return jlStatus;
}